

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a2a.h
# Opt level: O2

void bsplib::serial<unsigned_long>(A2A *a2a,int pid,unsigned_long x)

{
  ssize_t sVar1;
  int in_R8D;
  Buffer buf;
  undefined1 local_22 [10];
  
  sVar1 = UIntSerialize<unsigned_long>::write((int)x,local_22,x);
  A2A::send(a2a,pid,local_22,(long)(int)sVar1,in_R8D);
  return;
}

Assistant:

void serial( A2A & a2a, int pid, UInt x ) {
    typedef UIntSerialize< UInt > S;     
    typename S::Buffer buf;
    { const int n = S::write(x, buf );
      a2a.send( pid, buf, n );
    }
}